

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.c
# Opt level: O2

unsigned_long crc32(crc32_t *crc,uchar *data,unsigned_long len)

{
  unsigned_long uVar1;
  ulong uVar2;
  
  uVar2 = crc->init;
  for (uVar1 = 0; len != uVar1; uVar1 = uVar1 + 1) {
    uVar2 = uVar2 << 8 ^ crc->table[(ulong)data[uVar1] ^ uVar2 >> 0x18];
  }
  return (ulong)((uint)uVar2 ^ (uint)crc->xor);
}

Assistant:

unsigned long crc32(crc32_t *crc,
                    unsigned char *data, unsigned long len) {
  unsigned long r = crc->init;
  unsigned char *ptr = data;
  while (len--)
    r = (r << 8) ^ crc->table[(r >> 24) ^ *ptr++];

  r ^= crc->xor;
  r &= 0xFFFFFFFF;
  return r;
}